

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

QString * __thiscall
QUrlQuery::queryItemValue
          (QString *__return_storage_ptr__,QUrlQuery *this,QString *key,
          ComponentFormattingOptions encoding)

{
  QUrlQueryPrivate *pQVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QUrlQueryPrivate *)0x0) {
    cVar2 = QUrlQueryPrivate::findKey(pQVar1,key);
    pQVar1 = (this->d).d.ptr;
    if (cVar2.i != (pQVar1->itemList).d.ptr + (pQVar1->itemList).d.size) {
      QUrlQueryPrivate::recodeToUser(&local_38,pQVar1,&(cVar2.i)->second,encoding);
      (__return_storage_ptr__->d).d = local_38.d.d;
      (__return_storage_ptr__->d).ptr = local_38.d.ptr;
      (__return_storage_ptr__->d).size = local_38.d.size;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlQuery::queryItemValue(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QString result;
    if (d) {
        Map::const_iterator it = d->findKey(key);
        if (it != d->itemList.constEnd())
            result = d->recodeToUser(it->second, encoding);
    }
    return result;
}